

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testStringHelper(exr_context_t f)

{
  exr_result_t eVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  void *__s;
  ostream *poVar5;
  ostream *this;
  bool bVar6;
  exr_result_t _test_rv_45;
  exr_result_t _test_rv_44;
  exr_result_t _test_rv_43;
  exr_result_t _test_rv_42;
  exr_result_t _test_rv_41;
  exr_result_t _test_rv_40;
  char *tmp;
  size_t nbytes;
  exr_result_t _test_rv_39;
  exr_result_t _test_rv_38;
  exr_result_t _test_rv_37;
  exr_result_t _test_rv_36;
  exr_result_t _test_rv_35;
  exr_result_t _test_rv_34;
  exr_result_t _test_rv_33;
  exr_result_t _test_rv_32;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_attr_string_t nil;
  exr_attr_string_t s;
  char *in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  uint uVar7;
  ostream *in_stack_fffffffffffffca8;
  exr_attr_string_t *in_stack_fffffffffffffcb0;
  ostream *in_stack_fffffffffffffcb8;
  exr_attr_string_t *in_stack_fffffffffffffcc0;
  exr_context_t in_stack_fffffffffffffcc8;
  undefined1 local_28 [16];
  int local_18;
  int local_14;
  char *local_10;
  
  uVar7 = (uint)((ulong)in_stack_fffffffffffffca0 >> 0x20);
  memset(local_28,0,0x10);
  eVar1 = exr_attr_string_init
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static_with_length
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (char *)in_stack_fffffffffffffcb8,
                     (int32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static_with_length
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (char *)in_stack_fffffffffffffcb8,
                     (int32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static_with_length
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (char *)in_stack_fffffffffffffcb8,
                     (int32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static_with_length
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (char *)in_stack_fffffffffffffcb8,
                     (int32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (int32_t)((ulong)in_stack_fffffffffffffca8 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_10 == (char *)0x0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 5) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_10 != (char *)0x0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    bVar6 = *local_10 == '\0';
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 1) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    bVar6 = *local_10 == '\0';
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 10) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 0xb) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  set_malloc_fail_on(1);
  eVar1 = exr_attr_string_create
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  set_malloc_fail_off();
  if (eVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"exr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                              (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                              (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                              (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"openexr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 7) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"exr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"exr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_set_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (((local_10 != (char *)0x0) && (bVar6 = false, *local_10 == '\0')) &&
     (bVar6 = false, local_10[1] == '\0')) {
    bVar6 = local_10[2] == '\0';
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_10[local_18] != '\0') {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"exr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 7) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_create_with_length
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8,uVar7);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"ope");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                     (char *)in_stack_fffffffffffffca8);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"exr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_10 != (char *)0x0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_init_static_with_length
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (char *)in_stack_fffffffffffffcb8,
                     (int32_t)((ulong)in_stack_fffffffffffffcb0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  bVar6 = false;
  if (local_10 != (char *)0x0) {
    iVar2 = strcmp(local_10,"openexr");
    bVar6 = iVar2 == 0;
  }
  if (!bVar6) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_18 != 7) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  if (local_14 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  eVar1 = exr_attr_string_destroy
                    ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                   in_stack_fffffffffffffc98);
  }
  __s = malloc(0x80000001);
  if (__s != (void *)0x0) {
    memset(__s,0x42,0x80000000);
    *(undefined1 *)((long)__s + 0x80000000) = 0;
    eVar1 = exr_attr_string_init_static
                      ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                       (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n    expected: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(2);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     in_stack_fffffffffffffc98);
    }
    eVar1 = exr_attr_string_init_static
                      ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                       (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n    expected: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(3);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     in_stack_fffffffffffffc98);
    }
    eVar1 = exr_attr_string_create
                      ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                       (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar3 = std::operator<<(poVar3,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n    expected: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(2);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     in_stack_fffffffffffffc98);
    }
    eVar1 = exr_attr_string_create
                      ((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                       (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      in_stack_fffffffffffffcb8 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar3 = std::operator<<(in_stack_fffffffffffffcb8,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n    expected: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(3);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     in_stack_fffffffffffffc98);
    }
    eVar1 = exr_attr_string_set((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                                (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 2) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      in_stack_fffffffffffffca8 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar3 = std::operator<<(in_stack_fffffffffffffca8,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n    expected: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
      in_stack_fffffffffffffcb0 = (exr_attr_string_t *)std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(2);
      poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcb0,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     in_stack_fffffffffffffc98);
    }
    eVar1 = exr_attr_string_set((exr_context_t)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                                (char *)in_stack_fffffffffffffca8);
    if (eVar1 != 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
      poVar3 = std::operator<<(poVar3,") ");
      pcVar4 = (char *)exr_get_default_error_message(eVar1);
      poVar5 = std::operator<<(poVar3,pcVar4);
      poVar5 = std::operator<<(poVar5,"\n    expected: (");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      poVar5 = std::operator<<(poVar5,") ");
      pcVar4 = (char *)exr_get_default_error_message(3);
      this = std::operator<<(poVar5,pcVar4);
      uVar7 = (uint)((ulong)poVar5 >> 0x20);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      core_test_fail((char *)in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8,uVar7,
                     (char *)poVar3);
    }
    free(__s);
  }
  return;
}

Assistant:

static void
testStringHelper (exr_context_t f)
{
    exr_attr_string_t s, nil = {0};

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_init (NULL, &s, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_destroy (NULL, &s));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init (f, NULL, 1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init (f, &s, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_init_static (NULL, &s, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, &s, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_init_static_with_length (NULL, &s, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, NULL, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, &s, NULL, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_init_static_with_length (f, &s, "exr", -3));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &nil));

    EXRCORE_TEST_RVAL (exr_attr_string_init (f, &s, 4));
    EXRCORE_TEST (s.str != NULL);
    EXRCORE_TEST (s.length == 4);
    EXRCORE_TEST (s.alloc_size == 5);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    EXRCORE_TEST (s.str == NULL);
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 0);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_create (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_create (NULL, &s, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_create (f, &s, NULL));
    EXRCORE_TEST (s.str != NULL && s.str[0] == '\0');
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 1);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create_with_length (f, &s, NULL, 10));
    EXRCORE_TEST (s.str != NULL && s.str[0] == '\0');
    EXRCORE_TEST (s.length == 10);
    EXRCORE_TEST (s.alloc_size == 11);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_create (f, &s, "exr"));
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create (f, &s, "exr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 4);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_set (f, NULL, "exr"));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_set (NULL, &s, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_set (f, &s, "openexr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "openexr"));
    EXRCORE_TEST (s.length == 7);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_set_with_length (f, &s, "exr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (
        exr_attr_string_set_with_length (f, &s, "exropenexr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_set_with_length (f, &s, NULL, 3));
    EXRCORE_TEST (
        s.str != NULL && s.str[0] == '\0' && s.str[1] == '\0' &&
        s.str[2] == '\0');
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.str[s.length] == '\0');
    EXRCORE_TEST (s.alloc_size == 8);

    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_create_with_length (f, &s, "exr", 6));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 6);
    EXRCORE_TEST (s.alloc_size == 7);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (
        exr_attr_string_create_with_length (f, &s, "openexr", 3));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "ope"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 4);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    EXRCORE_TEST_RVAL (exr_attr_string_init_static (f, &s, "exr"));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "exr"));
    EXRCORE_TEST (s.length == 3);
    EXRCORE_TEST (s.alloc_size == 0);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    EXRCORE_TEST (s.str == NULL);
    EXRCORE_TEST (s.length == 0);
    EXRCORE_TEST (s.alloc_size == 0);

    EXRCORE_TEST_RVAL (
        exr_attr_string_init_static_with_length (f, &s, "openexr", 7));
    EXRCORE_TEST (s.str != NULL && !strcmp (s.str, "openexr"));
    EXRCORE_TEST (s.length == 7);
    EXRCORE_TEST (s.alloc_size == 0);
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));
    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_string_destroy (f, &s));

    size_t nbytes = (size_t) INT32_MAX + 1;
    char*  tmp    = (char*) malloc (nbytes + 1);
    // might be on a low memory machine, in which case just skip the test
    if (tmp)
    {
        memset (tmp, 'B', nbytes);
        tmp[nbytes] = '\0';

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG,
            exr_attr_string_init_static (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_init_static (f, &s, tmp));

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG,
            exr_attr_string_create (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_create (f, &s, tmp));

        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_MISSING_CONTEXT_ARG, exr_attr_string_set (NULL, &s, tmp));
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_INVALID_ARGUMENT, exr_attr_string_set (f, &s, tmp));
        free (tmp);
    }
}